

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O1

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_type(MutObjective *this,Type type)

{
  long lVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar2 = (this->
          super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  uVar4 = (ulong)iVar2;
  uVar5 = uVar4 + 0x3f;
  if (-1 < (long)uVar4) {
    uVar5 = uVar4;
  }
  lVar3 = ((long)uVar5 >> 6) * 8 +
          *(long *)&(((this->
                      super_BasicObjective<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                      ).super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.
                     problem_)->is_obj_max_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start;
  uVar5 = 1L << ((byte)iVar2 & 0x3f);
  lVar1 = (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) * 8 + -8;
  if (type == MAX) {
    uVar5 = uVar5 | *(ulong *)(lVar3 + lVar1);
  }
  else {
    uVar5 = ~uVar5 & *(ulong *)(lVar3 + lVar1);
  }
  *(ulong *)(lVar3 + lVar1) = uVar5;
  return;
}

Assistant:

void set_type(obj::Type type) const {
      this->problem_->is_obj_max_[this->index_] = (type == obj::MAX);
    }